

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::Randomize(Tensor *d)

{
  uint __x;
  Dim *in_RDI;
  real in_stack_0000000c;
  
  std::sqrt<int>(6);
  __x = Dim::sum_dims(in_RDI);
  std::sqrt<unsigned_int>(__x);
  Randomize(d,in_stack_0000000c);
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& d) {
  Randomize(d, sqrt(6) / sqrt(d.d.sum_dims()));
}